

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsSolution * __thiscall HEkk::getSolution(HEkk *this)

{
  value_type vVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RSI;
  HighsSolution *in_RDI;
  double dVar4;
  double dVar5;
  HighsInt iRow_2;
  HighsInt iCol;
  HighsInt iRow_1;
  HighsInt iRow;
  HighsSolution *solution;
  HighsSolution *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  int local_34;
  int local_30;
  int local_1c;
  int local_18;
  
  HighsSolution::HighsSolution(in_stack_ffffffffffffff70);
  for (local_18 = 0; local_18 < *(int *)(in_RSI + 0x219c); local_18 = local_18 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x2668),(long)local_18)
    ;
    vVar1 = *pvVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x2978),(long)local_18);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x25f0),(long)*pvVar3);
    *pvVar2 = vVar1;
  }
  for (local_1c = 0; local_1c < *(int *)(in_RSI + 0x219c); local_1c = local_1c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x2978),(long)local_1c);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x2578),(long)*pvVar3);
    *pvVar2 = 0.0;
  }
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  for (local_30 = 0; local_30 < *(int *)(in_RSI + 0x2198); local_30 = local_30 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x25f0),(long)local_30)
    ;
    vVar1 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->col_value,(long)local_30);
    *pvVar2 = vVar1;
    dVar4 = (double)*(int *)(in_RSI + 0x2288);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x2578),(long)local_30)
    ;
    dVar4 = dVar4 * *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->col_dual,(long)local_30);
    *pvVar2 = dVar4;
  }
  for (local_34 = 0; local_34 < *(int *)(in_RSI + 0x219c); local_34 = local_34 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x25f0),
                        (long)(*(int *)(in_RSI + 0x2198) + local_34));
    vVar1 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->row_value,(long)local_34);
    *pvVar2 = -vVar1;
    dVar5 = (double)-*(int *)(in_RSI + 0x2288);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x2578),
                        (long)(*(int *)(in_RSI + 0x2198) + local_34));
    dVar4 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->row_dual,(long)local_34);
    *pvVar2 = dVar5 * dVar4;
  }
  in_RDI->value_valid = true;
  in_RDI->dual_valid = true;
  return in_RDI;
}

Assistant:

HighsSolution HEkk::getSolution() {
  HighsSolution solution;
  // Scatter the basic primal values
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++)
    info_.workValue_[basis_.basicIndex_[iRow]] = info_.baseValue_[iRow];
  // Zero the basic dual values
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++)
    info_.workDual_[basis_.basicIndex_[iRow]] = 0;

  // Now we can get the solution
  solution.col_value.resize(lp_.num_col_);
  solution.col_dual.resize(lp_.num_col_);
  solution.row_value.resize(lp_.num_row_);
  solution.row_dual.resize(lp_.num_row_);

  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    solution.col_value[iCol] = info_.workValue_[iCol];
    solution.col_dual[iCol] = (HighsInt)lp_.sense_ * info_.workDual_[iCol];
  }
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    solution.row_value[iRow] = -info_.workValue_[lp_.num_col_ + iRow];
    // @FlipRowDual negate RHS
    solution.row_dual[iRow] =
        -(HighsInt)lp_.sense_ * info_.workDual_[lp_.num_col_ + iRow];
  }
  solution.value_valid = true;
  solution.dual_valid = true;
  return solution;
}